

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O1

void __thiscall
tchecker::typed_assign_statement_t::typed_assign_statement_t
          (typed_assign_statement_t *this,void **vtt,statement_type_t type,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::typed_expression_t> *rvalue)

{
  void *pvVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  invalid_argument *this_00;
  shared_ptr<const_tchecker::expression_t> local_48;
  shared_ptr<const_tchecker::lvalue_expression_t> local_38;
  
  pvVar1 = vtt[1];
  *(void **)&this->super_typed_statement_t = pvVar1;
  *(void **)(&(this->super_typed_statement_t).field_0x0 + *(long *)((long)pvVar1 + -0x38)) = vtt[2];
  (this->super_typed_statement_t)._type = type;
  peVar2 = (lvalue->
           super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_38.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
  }
  else {
    local_38.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             (&(peVar2->super_typed_expression_t).field_0x0 +
             *(long *)(*(long *)&peVar2->super_typed_expression_t + -0x40));
  }
  local_38.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (lvalue->
       super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_38.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.
            super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.
            super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar3 = (rvalue->
           super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar3 == (element_type *)0x0) {
    local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)&peVar3->field_0x0 + *(long *)(*(long *)peVar3 + -0x38));
  }
  local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (rvalue->
          super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  assign_statement_t::assign_statement_t
            (&this->super_assign_statement_t,vtt + 3,&local_38,&local_48);
  if (local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pvVar1 = *vtt;
  *(void **)&this->super_typed_statement_t = pvVar1;
  *(void **)(&(this->super_typed_statement_t).field_0x0 + *(long *)((long)pvVar1 + -0x38)) = vtt[5];
  *(void **)&this->super_assign_statement_t = vtt[6];
  iVar4 = (**(code **)(*(long *)&((lvalue->
                                  super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->super_typed_expression_t + 0x38))();
  if (iVar4 == 1) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid lvalue expression");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typed_assign_statement_t::typed_assign_statement_t(enum tchecker::statement_type_t type,
                                                   std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & lvalue,
                                                   std::shared_ptr<tchecker::typed_expression_t const> const & rvalue)
    : tchecker::typed_statement_t(type), tchecker::assign_statement_t(lvalue, rvalue)
{
  if (lvalue->size() != 1)
    throw std::invalid_argument("invalid lvalue expression");
}